

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O2

type __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::operator=
          (optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *this,
          optional<tinyusdz::Animatable<tinyusdz::Visibility>_> *other)

{
  value_type *pvVar1;
  
  if (this->has_value_ == true) {
    if (other->has_value_ == false) {
      reset(this);
    }
    else {
      pvVar1 = operator*(other);
      tinyusdz::Animatable<tinyusdz::Visibility>::operator=
                ((Animatable<tinyusdz::Visibility> *)&this->contained,pvVar1);
    }
  }
  else if (other->has_value_ != false) {
    pvVar1 = operator*(other);
    optional<tinyusdz::Animatable<tinyusdz::Visibility>>::
    initialize<tinyusdz::Animatable<tinyusdz::Visibility>>
              ((optional<tinyusdz::Animatable<tinyusdz::Visibility>> *)this,pvVar1);
  }
  return this;
}

Assistant:

operator=( optional && other ) noexcept
    {
        if      ( (has_value() == true ) && (other.has_value() == false) ) { reset(); }
        else if ( (has_value() == false) && (other.has_value() == true ) ) { initialize( std::move( *other ) ); }
        else if ( (has_value() == true ) && (other.has_value() == true ) ) { contained.value() = std::move( *other ); }
        return *this;
    }